

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

float __thiscall embree::XMLLoader::load<float>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  runtime_error *this_01;
  float fVar1;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)(xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 0x48) {
    fVar1 = Token::Float(this_00,true);
    return fVar1;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&sStack_58,&xml->ptr->loc);
  std::operator+(&local_38,&sStack_58,": wrong float body");
  std::runtime_error::runtime_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string getString() const { return str;   }